

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void s390x_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  TranslationBlock *pTVar1;
  ulong uVar2;
  
  dcbase[3].pc_first = (target_ulong)cs->uc;
  pTVar1 = dcbase->tb;
  if ((pTVar1->flags & 2) == 0) {
    uVar2 = (ulong)((uint)dcbase->pc_first & 0x7fffffff);
    dcbase->pc_first = uVar2;
    dcbase->pc_next = uVar2;
  }
  *(undefined4 *)&dcbase[2].singlestep_enabled = 4;
  dcbase[2].pc_next = pTVar1->cs_base;
  *(_Bool *)&dcbase[3].tb = dcbase->singlestep_enabled;
  return;
}

Assistant:

static void s390x_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;

    // unicorn handle
    dc->uc = uc;

    /* 31-bit mode */
    if (!(dc->base.tb->flags & FLAG_MASK_64)) {
        dc->base.pc_first &= 0x7fffffff;
        dc->base.pc_next = dc->base.pc_first;
    }

    dc->cc_op = CC_OP_DYNAMIC;
    dc->ex_value = dc->base.tb->cs_base;
    dc->do_debug = dc->base.singlestep_enabled;
}